

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  bool bVar1;
  bool bVar2;
  Index IVar3;
  VectorXd *other;
  int __x;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this_00;
  Scalar SVar4;
  Scalar SVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa;
  double dVar12;
  double dVar13;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double y_m;
  double x_m;
  undefined1 local_138 [4];
  int Nroots_inside;
  anon_class_64_1_54a39805 secant;
  ChebyshevExpansion *e;
  bool in2;
  bool in1;
  double sqrtD;
  double root2;
  double root1;
  double D;
  double local_c0;
  double c;
  double b;
  double a;
  double d;
  double *y_3;
  double *x_3;
  double *y_2;
  double *x_2;
  double *y_1;
  double *x_1;
  double dStack_68;
  int i;
  double ytol;
  VectorXd yy;
  undefined1 local_40 [8];
  VectorXd xscaled;
  Index Ndegree_scaled;
  Index N;
  bool only_in_domain_local;
  ChebyshevExpansion *this_local;
  vector<double,_std::allocator<double>_> *roots;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  xscaled.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (IVar3 + -1) * 2;
  other = get_CLnodes(xscaled.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40,other);
  y_Clenshaw_xscaled((ChebyshevExpansion *)&ytol,&this->m_c);
  SVar4 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::maxCoeff
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ytol);
  SVar5 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::minCoeff
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ytol);
  dStack_68 = (SVar4 - SVar5) * 1e-14;
  for (x_1._4_4_ = 0;
      (long)(x_1._4_4_ + 2) <
      xscaled.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 1;
      x_1._4_4_ = x_1._4_4_ + 2) {
    y_1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                     (long)x_1._4_4_);
    x_2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol,
                     (long)x_1._4_4_);
    y_2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                     (long)(x_1._4_4_ + 1));
    x_3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol,
                     (long)(x_1._4_4_ + 1));
    y_3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                     (long)(x_1._4_4_ + 2));
    this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol;
    d = (double)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (this_00,(long)(x_1._4_4_ + 2));
    __x = (int)this_00;
    a = (*y_3 - *y_2) * (*y_2 - *y_1) * (*y_3 - *y_1);
    b = ((*y_2 - *y_1) * *(double *)d + ((*y_3 - *y_2) * *x_2 - (*y_3 - *y_1) * *x_3)) / a;
    dVar6 = POW2<double>(*y_3);
    dVar7 = POW2<double>(*y_2);
    dVar12 = *x_2;
    dVar8 = POW2<double>(*y_3);
    dVar9 = POW2<double>(*y_1);
    dVar13 = *x_3;
    dVar10 = POW2<double>(*y_2);
    dVar11 = POW2<double>(*y_1);
    c = ((-(dVar6 - dVar7) * dVar12 + (dVar8 - dVar9) * dVar13) - (dVar10 - dVar11) * *(double *)d)
        / a;
    dVar12 = *y_3;
    dVar13 = *y_2;
    dVar6 = *y_1;
    local_c0 = ((dVar13 - dVar6) * dVar13 * dVar6 * *(double *)d +
               ((dVar12 - dVar13) * dVar13 * dVar12 * *x_2 -
               (dVar12 - dVar6) * dVar6 * dVar12 * *x_3)) / a;
    std::abs(__x);
    if (dStack_68 <= extraout_XMM0_Qa) {
      dVar12 = c * c + -(b * 4.0 * local_c0);
      if (0.0 <= dVar12) {
        if ((b != 0.0) || (NAN(b))) {
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            dVar12 = sqrt(dVar12);
            if (c < 0.0) {
              root2 = (local_c0 * 2.0) / (-c + dVar12);
              sqrtD = (-c + dVar12) / (b * 2.0);
            }
            else {
              root2 = (-c - dVar12) / (b * 2.0);
              sqrtD = (local_c0 * 2.0) / (-c - dVar12);
            }
          }
          else {
            root2 = -c / (b * 2.0);
            sqrtD = -1000.0;
          }
        }
        else {
          root2 = -local_c0 / c;
          sqrtD = -1000.0;
        }
        bVar1 = inbetween<double>(*y_1,*y_3,root2);
        bVar2 = inbetween<double>(*y_1,*y_3,sqrtD);
        secant.e.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows = (Index)this;
        ChebyshevExpansion((ChebyshevExpansion *)local_138,this);
        x_m._4_4_ = (uint)bVar1 + (uint)bVar2;
        if (x_m._4_4_ == 2) {
          y_m = -c / (b + b);
          local_150 = y_Clenshaw_xscaled((ChebyshevExpansion *)
                                         secant.e.m_nodal_value_cache.
                                         super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_rows,y_m);
          dVar12 = real_roots2::anon_class_64_1_54a39805::operator()
                             ((anon_class_64_1_54a39805 *)local_138,*y_1,*x_2,y_m,local_150,1e-14,
                              1e-14);
          dVar13 = real_roots2::anon_class_64_1_54a39805::operator()
                             ((anon_class_64_1_54a39805 *)local_138,y_m,local_150,*y_3,*(double *)d,
                              1e-14,1e-14);
          local_158 = ((this->m_xmax - this->m_xmin) * dVar12 + this->m_xmax + this->m_xmin) * 0.5;
          std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_158)
          ;
          local_160 = ((this->m_xmax - this->m_xmin) * dVar13 + this->m_xmax + this->m_xmin) * 0.5;
          std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_160)
          ;
        }
        else if (x_m._4_4_ == 1) {
          dVar12 = real_roots2::anon_class_64_1_54a39805::operator()
                             ((anon_class_64_1_54a39805 *)local_138,*y_1,*x_2,*y_3,*(double *)d,
                              1e-14,1e-14);
          local_168 = ((this->m_xmax - this->m_xmin) * dVar12 + this->m_xmax + this->m_xmin) * 0.5;
          std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_168)
          ;
        }
        real_roots2(bool)::~__0((real_roots2_bool_ *)local_138);
      }
    }
    else {
      D = ((this->m_xmax - this->m_xmin) * *y_1 + this->m_xmax + this->m_xmin) * 0.5;
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&D);
    }
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&ytol);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots2(bool only_in_domain) const {
        //vector of roots to be returned
        std::vector<double> roots;

        auto N = m_c.size()-1;
        auto Ndegree_scaled = N*2;
        Eigen::VectorXd xscaled = get_CLnodes(Ndegree_scaled), yy = y_Clenshaw_xscaled(xscaled);
        double ytol = 1e-14*(yy.maxCoeff()-yy.minCoeff());
        
        // a,b,c can also be obtained by solving the matrix system:
        // [x_k^2, x_k, 1] = [b_k] for k in 1,2,3
        for (auto i = 0; i+2 < Ndegree_scaled+1; i += 2){
            const double &x_1 = xscaled[i + 0], &y_1 = yy[i + 0],
                         &x_2 = xscaled[i + 1], &y_2 = yy[i + 1],
                         &x_3 = xscaled[i + 2], &y_3 = yy[i + 2];
            double d = (x_3 - x_2)*(x_2 - x_1)*(x_3 - x_1);
            double a = ((x_3 - x_2)*y_1 - (x_3 - x_1)*y_2 + (x_2 - x_1)*y_3) / d;
            double b = (-(POW2(x_3) - POW2(x_2))*y_1 + (POW2(x_3) - POW2(x_1))*y_2 - (POW2(x_2) - POW2(x_1))*y_3) / d;
            double c = ((x_3 - x_2)*x_2*x_3*y_1 - (x_3 - x_1)*x_1*x_3*y_2 + (x_2 - x_1)*x_2*x_1*y_3) / d;

            // Check if precisely at a nodal value
            if (std::abs(y_1) < ytol) {
                roots.push_back(((m_xmax - m_xmin) * x_1 + (m_xmax + m_xmin)) / 2.0);
                continue;
            }

            // Discriminant of quadratic
            double D = b*b - 4*a*c;
            if (D >= 0) {
                double root1, root2;
                if (a == 0){
                    // Linear
                    root1 = -c/b;
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else if (D == 0) { // Unlikely due to numerical precision
                    // Two equal real roots
                    root1 = -b/(2*a);
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else {
                    // Numerically stable method for solving quadratic
                    // From https://people.csail.mit.edu/bkph/articles/Quadratics.pdf
                    double sqrtD = sqrt(D);
                    if (b >= 0){
                        root1 = (-b - sqrtD)/(2*a);
                        root2 = 2*c/(-b-sqrtD);
                    }
                    else {
                        root1 = 2*c/(-b+sqrtD);
                        root2 = (-b+sqrtD)/(2*a);
                    }
                }
                bool in1 = inbetween(x_1, x_3, root1), in2 = inbetween(x_1, x_3, root2);
                const ChebyshevExpansion &e = *this;
                auto secant = [e](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
                    auto c = b - yb*(b - a) / (yb - ya);
                    auto yc = e.y_Clenshaw_xscaled(c);
                    for (auto i = 0; i < 50; ++i){
                        if (yc*ya > 0) {
                            a=c; ya=yc;
                        }
                        else {
                            b=c; yb=yc;
                        }
                        if (std::abs(b - a) < xeps) { break; }
                        if (std::abs(yc) < yeps){ break; }
                        c = b - yb*(b - a) / (yb - ya);
                        yc = e.y_Clenshaw_xscaled(c);
                    }
                    return c;
                };
                int Nroots_inside = static_cast<int>(in1) + static_cast<int>(in2);
                if (Nroots_inside == 2) {
                    // Split the domain at the midline of the quadratic, polish each root against the underlying expansion
                    double x_m = -b/(2*a), y_m = e.y_Clenshaw_xscaled(x_m);
                    root1 = secant(x_1, y_1, x_m, y_m);
                    root2 = secant(x_m, y_m, x_3, y_3);
                    // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0); 
                    roots.push_back(((m_xmax - m_xmin)*root2 + (m_xmax + m_xmin)) / 2.0);
                }
                else if(Nroots_inside == 1) {
                    root1 = secant(x_1, y_1, x_3, y_3);
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0);
                }
                else {}
            }
        }
        return roots;
    }